

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

void MAi_summarize_allocated_blocks(int index_base)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  uint in_EDI;
  char *pcVar4;
  ErrorType unaff_retaddr;
  ErrorLevel unaff_retaddr_00;
  int stack_blocks;
  int heap_blocks;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  undefined4 in_stack_fffffffffffffff8;
  
  ma_stats.calls[0x1e] = ma_stats.calls[0x1e] + 1;
  if ((in_EDI == 0) || (in_EDI == 1)) {
    printf("MA_summarize_allocated_blocks: starting scan ...\n");
    uVar1 = list_print((AD *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                       (char *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4)
    ;
    uVar2 = list_print((AD *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)CONCAT44(in_EDI,uVar1)
                       ,in_stack_fffffffffffffff4);
    printf("MA_summarize_allocated_blocks: scan completed: ");
    pcVar3 = "s";
    if (uVar1 == 1) {
      pcVar3 = "";
    }
    pcVar4 = "s";
    if (uVar2 == 1) {
      pcVar4 = "";
    }
    printf("%d heap block%s, %d stack block%s\n",(ulong)uVar1,pcVar3,(ulong)uVar2,pcVar4);
  }
  else {
    sprintf(ma_ebuf,"invalid index_base: %d",(ulong)in_EDI);
    ma_error(unaff_retaddr_00,unaff_retaddr,(char *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),
             (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

public void MAi_summarize_allocated_blocks(index_base)
    int        index_base;    /* 0 (C) or 1 (FORTRAN) */
{
    int        heap_blocks;    /* # of blocks on heap used list */
    int        stack_blocks;    /* # of blocks on stack used list */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_summarize_allocated_blocks]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return;
#endif /* VERIFY */

    /* verify index_base */
    if ((index_base != 0) && (index_base != 1))
    {
        (void)sprintf(ma_ebuf,
            "invalid index_base: %d",
            index_base);
        ma_error(EL_Nonfatal, ET_Internal, "MAi_summarize_allocated_blocks", ma_ebuf);
        return;
    }

    (void)printf("MA_summarize_allocated_blocks: starting scan ...\n");

    /* print blocks on the heap used list */
    heap_blocks = list_print(ma_hused, "heap", index_base);

    /* print blocks on the stack used list */
    stack_blocks = list_print(ma_sused, "stack", index_base);

    (void)printf("MA_summarize_allocated_blocks: scan completed: ");
    (void)printf("%d heap block%s, %d stack block%s\n",
        heap_blocks,
        plural(heap_blocks),
        stack_blocks,
        plural(stack_blocks));
}